

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O3

void Diligent::LogError<false,char[22],char[17],unsigned_int>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [22],
               char (*Args_1) [17],uint *Args_2)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  char (*Args_2_00) [22];
  string FileName;
  char local_71;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  Args_2_00 = Args;
  std::__cxx11::string::string((string *)&local_50,FullFilePath,(allocator *)&local_70);
  lVar1 = std::__cxx11::string::find_last_of((char *)&local_50,0x32e513,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::erase((ulong)&local_50,0);
  }
  FormatString<char[22],char[17],unsigned_int>
            (&local_70,(Diligent *)Args,(char (*) [22])Args_1,(char (*) [17])Args_2,
             (uint *)Args_2_00);
  if (DebugMessageCallback == (undefined *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Diligent Engine: ",0x11);
    pcVar4 = "Error";
    if (IsFatal) {
      pcVar4 = "Fatal Error";
    }
    lVar1 = 5;
    if (IsFatal) {
      lVar1 = 0xb;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    if (Function == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x436550);
    }
    else {
      sVar2 = strlen(Function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,Function,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"() (",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,Line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
    local_71 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_71,1);
  }
  else {
    (*(code *)DebugMessageCallback)(IsFatal | 2,local_70._M_dataplus._M_p,Function,local_50,Line);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}